

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_iTXt(ucvector *out,uint compressed,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  uint uVar1;
  uint extraout_EAX;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *data;
  ulong uVar7;
  ulong __size;
  ulong uVar8;
  size_t sVar9;
  uchar uVar10;
  bool bVar11;
  ucvector compressed_data;
  uchar *local_58;
  size_t sStack_50;
  undefined8 local_48;
  uchar *local_40;
  uchar *local_38;
  
  local_38 = (uchar *)transkey;
  puVar2 = (uchar *)strlen(textstring);
  uVar10 = *keyword;
  local_40 = (uchar *)langtag;
  if (uVar10 == '\0') {
    uVar1 = (uint)CONCAT71((int7)((ulong)puVar2 >> 8),1);
    data = (uchar *)0x0;
    uVar7 = 0;
    uVar5 = 0;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    uVar5 = 0;
    uVar7 = 0;
    data = (uchar *)0x0;
    puVar3 = puVar2;
    do {
      uVar6 = uVar7 + 1;
      if (uVar5 < uVar6) {
        __size = uVar6 * 3 >> 1;
        if (uVar5 * 2 < uVar6) {
          __size = uVar6;
        }
        puVar3 = (uchar *)realloc(data,__size);
        bVar11 = puVar3 == (uchar *)0x0;
        if (!bVar11) {
          uVar5 = __size;
          data = puVar3;
        }
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        data[uVar7] = uVar10;
        uVar7 = uVar6;
      }
      uVar10 = keyword[uVar8 + 2];
      uVar8 = uVar8 + 1;
    } while (uVar10 != '\0');
    uVar1 = (uint)CONCAT71((int7)((ulong)puVar3 >> 8),0x4e < uVar8);
  }
  if ((char)uVar1 == '\0') {
    uVar8 = uVar7 + 1;
    if (uVar5 < uVar8) {
      uVar6 = uVar8 * 3 >> 1;
      if (uVar5 * 2 < uVar8) {
        uVar6 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar6);
      if (puVar3 == (uchar *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = false;
        uVar5 = uVar6;
        data = puVar3;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar7] = '\0';
      uVar7 = uVar8;
    }
    uVar8 = uVar7 + 1;
    if (uVar5 < uVar8) {
      uVar6 = uVar8 * 3 >> 1;
      if (uVar5 * 2 < uVar8) {
        uVar6 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar6);
      if (puVar3 == (uchar *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = false;
        uVar5 = uVar6;
        data = puVar3;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar7] = compressed != 0;
      uVar7 = uVar8;
    }
    uVar8 = uVar7 + 1;
    if (uVar5 < uVar8) {
      uVar6 = uVar8 * 3 >> 1;
      if (uVar5 * 2 < uVar8) {
        uVar6 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar6);
      if (puVar3 == (uchar *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = false;
        uVar5 = uVar6;
        data = puVar3;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar7] = '\0';
      uVar7 = uVar8;
    }
    uVar10 = *local_40;
    puVar3 = local_40;
    while (uVar10 != '\0') {
      puVar3 = puVar3 + 1;
      uVar8 = uVar7 + 1;
      if (uVar5 < uVar8) {
        uVar6 = uVar8 * 3 >> 1;
        if (uVar5 * 2 < uVar8) {
          uVar6 = uVar8;
        }
        puVar4 = (uchar *)realloc(data,uVar6);
        if (puVar4 == (uchar *)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = false;
          uVar5 = uVar6;
          data = puVar4;
        }
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        data[uVar7] = uVar10;
        uVar7 = uVar8;
      }
      uVar10 = *puVar3;
    }
    uVar8 = uVar7 + 1;
    if (uVar5 < uVar8) {
      uVar6 = uVar8 * 3 >> 1;
      if (uVar5 * 2 < uVar8) {
        uVar6 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar6);
      if (puVar3 == (uchar *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = false;
        uVar5 = uVar6;
        data = puVar3;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar7] = '\0';
      uVar7 = uVar8;
    }
    uVar10 = *local_38;
    puVar3 = local_38;
    while (uVar10 != '\0') {
      puVar3 = puVar3 + 1;
      uVar8 = uVar7 + 1;
      if (uVar5 < uVar8) {
        uVar6 = uVar8 * 3 >> 1;
        if (uVar5 * 2 < uVar8) {
          uVar6 = uVar8;
        }
        puVar4 = (uchar *)realloc(data,uVar6);
        if (puVar4 == (uchar *)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = false;
          uVar5 = uVar6;
          data = puVar4;
        }
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        data[uVar7] = uVar10;
        uVar7 = uVar8;
      }
      uVar10 = *puVar3;
    }
    uVar8 = uVar7 + 1;
    if (uVar5 < uVar8) {
      uVar6 = uVar8 * 3 >> 1;
      if (uVar5 * 2 < uVar8) {
        uVar6 = uVar8;
      }
      puVar3 = (uchar *)realloc(data,uVar6);
      if (puVar3 == (uchar *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = false;
        uVar5 = uVar6;
        data = puVar3;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar7] = '\0';
      uVar7 = uVar8;
    }
    if (compressed == 0) {
      uVar10 = *textstring;
      bVar11 = true;
      if (uVar10 != '\0') {
        do {
          textstring = (char *)((uchar *)textstring + 1);
          uVar8 = uVar7 + 1;
          if (uVar5 < uVar8) {
            uVar6 = uVar8 * 3 >> 1;
            if (uVar5 * 2 < uVar8) {
              uVar6 = uVar8;
            }
            puVar2 = (uchar *)realloc(data,uVar6);
            if (puVar2 == (uchar *)0x0) {
              bVar11 = true;
            }
            else {
              bVar11 = false;
              uVar5 = uVar6;
              data = puVar2;
            }
          }
          else {
            bVar11 = false;
          }
          if (!bVar11) {
            data[uVar7] = uVar10;
            uVar7 = uVar8;
          }
          uVar10 = *textstring;
        } while (uVar10 != '\0');
        bVar11 = true;
      }
    }
    else {
      local_58 = (uchar *)0x0;
      sStack_50 = 0;
      local_48 = 0;
      if (zlibsettings->custom_zlib ==
          (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
        uVar1 = lodepng_zlib_compress
                          (&local_58,&sStack_50,(uchar *)textstring,(size_t)puVar2,zlibsettings);
      }
      else {
        uVar1 = (*zlibsettings->custom_zlib)
                          (&local_58,&sStack_50,(uchar *)textstring,(size_t)puVar2,zlibsettings);
      }
      if ((uVar1 == 0) && (sStack_50 != 0)) {
        sVar9 = 0;
        do {
          uVar10 = local_58[sVar9];
          uVar8 = uVar7 + 1;
          if (uVar5 < uVar8) {
            uVar6 = uVar8 * 3 >> 1;
            if (uVar5 * 2 < uVar8) {
              uVar6 = uVar8;
            }
            puVar2 = (uchar *)realloc(data,uVar6);
            if (puVar2 == (uchar *)0x0) {
              bVar11 = true;
            }
            else {
              bVar11 = false;
              data = puVar2;
              uVar5 = uVar6;
            }
          }
          else {
            bVar11 = false;
          }
          if (!bVar11) {
            data[uVar7] = uVar10;
            uVar7 = uVar8;
          }
          sVar9 = sVar9 + 1;
        } while (sVar9 != sStack_50);
      }
      sStack_50 = 0;
      local_48 = 0;
      free(local_58);
      bVar11 = uVar1 == 0;
    }
    if ((bVar11) &&
       (uVar1 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar7,"iTXt",data), uVar1 == 0)) {
      out->allocsize = out->size;
    }
    free(data);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compressed, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings)
{
  unsigned error = 0;
  ucvector data;
  size_t i, textsize = strlen(textstring);

  ucvector_init(&data);

  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*null termination char*/
  ucvector_push_back(&data, compressed ? 1 : 0); /*compression flag*/
  ucvector_push_back(&data, 0); /*compression method*/
  for(i = 0; langtag[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)langtag[i]);
  ucvector_push_back(&data, 0); /*null termination char*/
  for(i = 0; transkey[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)transkey[i]);
  ucvector_push_back(&data, 0); /*null termination char*/

  if(compressed)
  {
    ucvector compressed_data;
    ucvector_init(&compressed_data);
    error = zlib_compress(&compressed_data.data, &compressed_data.size,
                          (unsigned char*)textstring, textsize, zlibsettings);
    if(!error)
    {
      for(i = 0; i != compressed_data.size; ++i) ucvector_push_back(&data, compressed_data.data[i]);
    }
    ucvector_cleanup(&compressed_data);
  }
  else /*not compressed*/
  {
    for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)textstring[i]);
  }

  if(!error) error = addChunk(out, "iTXt", data.data, data.size);
  ucvector_cleanup(&data);
  return error;
}